

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void prvTidyDefineMutedMessage(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  uint uVar1;
  tidyStrings tVar2;
  tidyStrings *__ptr;
  uint uVar3;
  
  tVar2 = prvTidytidyErrorCodeFromKey(name);
  if (tVar2 - REPORT_MESSAGE_LAST < 0xffffff90) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x275,opt->name,name);
    return;
  }
  __ptr = (doc->muted).list;
  if (__ptr == (tidyStrings *)0x0) {
    __ptr = (tidyStrings *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x28);
    (doc->muted).list = __ptr;
    *__ptr = 0;
    (doc->muted).count = 0;
    (doc->muted).capacity = 10;
    uVar3 = 0;
  }
  else {
    uVar3 = (doc->muted).count;
    uVar1 = (doc->muted).capacity;
    if (uVar1 <= uVar3) {
      uVar1 = uVar1 * 2;
      (doc->muted).capacity = uVar1;
      __ptr = (tidyStrings *)realloc(__ptr,(ulong)uVar1 * 4 + 1);
      (doc->muted).list = __ptr;
      uVar3 = (doc->muted).count;
    }
  }
  __ptr[uVar3] = tVar2;
  uVar3 = (doc->muted).count + 1;
  (doc->muted).count = uVar3;
  __ptr[uVar3] = 0;
  prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x278,name);
  return;
}

Assistant:

void TY_(DefineMutedMessage)(TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name)
{
    enum { capacity = 10 };
    TidyMutedMessages *list = &(doc->muted);
    tidyStrings message = TY_(tidyErrorCodeFromKey)( name );

    if ( message <= REPORT_MESSAGE_FIRST || message >= REPORT_MESSAGE_LAST)
    {
        TY_(Report)( doc, NULL, NULL, STRING_ARGUMENT_BAD, opt->name, name );
        return;
    }

    if ( !list->list )
    {
        list->list = TidyAlloc(doc->allocator, sizeof(tidyStrings) * capacity );
        list->list[0] = 0;
        list->capacity = capacity;
        list->count = 0;
    }

    if ( list->count >= list->capacity )
    {
        list->capacity = list->capacity * 2;
        list->list = realloc( list->list, sizeof(tidyStrings) * list->capacity + 1 );
    }

    list->list[list->count] = message;
    list->count++;
    list->list[list->count] = 0;

    /* Must come *after* adding to the list, in case it's muted, too. */
    TY_(Report)( doc, NULL, NULL, STRING_MUTING_TYPE, name );
}